

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcSymFunc * __thiscall CTPNCodeBodyBase::get_replaced_func(CTPNCodeBodyBase *this)

{
  CTPNCodeBodyBase *this_00;
  CTPNCodeBody *pCVar1;
  CTPNCodeBodyBase *in_RDI;
  CTPNCodeBody *enc;
  CTcSymFunc *b;
  undefined8 local_8;
  
  this_00 = (CTPNCodeBodyBase *)get_func_sym(in_RDI);
  if (this_00 == (CTPNCodeBodyBase *)0x0) {
    pCVar1 = get_enclosing(in_RDI);
    if (pCVar1 == (CTPNCodeBody *)0x0) {
      local_8 = (CTcSymFunc *)0x0;
    }
    else {
      local_8 = get_replaced_func(this_00);
    }
  }
  else {
    local_8 = CTcSymFuncBase::get_mod_base((CTcSymFuncBase *)this_00);
  }
  return local_8;
}

Assistant:

class CTcSymFunc *CTPNCodeBodyBase::get_replaced_func() const
{
    CTcSymFunc *b;
    CTPNCodeBody *enc;

    /* if we have an associated function symbol, it's the base function */
    if ((b = get_func_sym()) != 0)
        return b->get_mod_base();

    /* 
     *   if we have an enclosing code body, then 'replaced' here means the
     *   same thing it does there, since we don't explicitly replace anything
     *   here 
     */
    if ((enc = get_enclosing()) != 0)
        return enc->get_replaced_func();

    /* if we haven't found anything yet, we don't have a base function */
    return 0;
}